

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d16_v2_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ushort uVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  uint16_t *in_RDI;
  int in_R8D;
  byte in_stack_00000008;
  __m256i ff;
  __m256i max;
  __m256i res1;
  __m256i res0;
  __m256i signal [3];
  __m256i *in_stack_fffffffffffffe40;
  __m256i *in_stack_fffffffffffffe48;
  __m256i *in_stack_fffffffffffffe50;
  undefined6 in_stack_fffffffffffffe58;
  __m256i *in_stack_fffffffffffffe60;
  __m256i *in_stack_fffffffffffffe68;
  __m256i *in_stack_fffffffffffffe70;
  __m256i *in_stack_fffffffffffffea0;
  int16_t *in_stack_fffffffffffffea8;
  longlong local_120 [14];
  int local_ac;
  long local_a8;
  long local_a0;
  long local_98;
  uint16_t *local_90;
  ushort local_82;
  undefined1 local_80 [32];
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  
  uVar3 = (short)(1 << (in_stack_00000008 & 0x1f)) - 1;
  auVar1 = vpinsrw_avx(ZEXT216(uVar3),(uint)uVar3,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar3),(uint)uVar3,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,7);
  local_80._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_ac = in_R8D;
  local_a8 = in_RCX;
  local_a0 = in_RDX;
  local_98 = in_RSI;
  local_90 = in_RDI;
  local_82 = uVar3;
  local_50 = uVar3;
  local_4e = uVar3;
  local_4c = uVar3;
  local_4a = uVar3;
  local_48 = uVar3;
  local_46 = uVar3;
  local_44 = uVar3;
  local_42 = uVar3;
  local_40 = uVar3;
  local_3e = uVar3;
  local_3c = uVar3;
  local_3a = uVar3;
  local_38 = uVar3;
  local_36 = uVar3;
  local_34 = uVar3;
  local_32 = uVar3;
  pack_2t_filter(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  pack_16x2_init(local_90,(__m256i *)local_120);
  do {
    pack_16x2_2t_pixels((uint16_t *)in_stack_fffffffffffffe70,(ptrdiff_t)in_stack_fffffffffffffe68,
                        in_stack_fffffffffffffe60);
    filter_16x2_2t_pixels
              ((__m256i *)CONCAT26(uVar3,in_stack_fffffffffffffe58),in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    store_16x1_pixels(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                      (uint16_t *)CONCAT26(uVar3,in_stack_fffffffffffffe58));
    local_90 = local_90 + local_98;
    local_a0 = local_a8 * 2 + local_a0;
    local_ac = local_ac + -1;
  } while (local_ac != 0);
  return;
}

Assistant:

static void aom_highbd_filter_block1d16_v2_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m256i signal[3], res0, res1;
  const __m256i max = _mm256_set1_epi16((1 << bd) - 1);
  __m256i ff;

  pack_2t_filter(filter, &ff);
  pack_16x2_init(src_ptr, signal);

  do {
    pack_16x2_2t_pixels(src_ptr, src_pitch, signal);
    filter_16x2_2t_pixels(signal, &ff, &res0, &res1);
    store_16x1_pixels(&res0, &res1, &max, dst_ptr);

    src_ptr += src_pitch;
    dst_ptr += dst_pitch;
    height -= 1;
  } while (height > 0);
}